

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O1

ull getbf(bitfield *bf,ull *a,ull *m)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  iVar8 = bf->shr;
  lVar9 = 0;
  uVar3 = 0;
  do {
    iVar1 = bf->sbf[lVar9].pos;
    iVar6 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar6 = iVar1;
    }
    iVar2 = bf->sbf[lVar9].len;
    uVar10 = ~(-1L << ((byte)iVar2 & 0x3f));
    bVar4 = (byte)(iVar1 % 0x40);
    uVar7 = uVar10 << (bVar4 & 0x3f);
    lVar11 = (long)(iVar6 >> 6);
    m[lVar11] = m[lVar11] | uVar7;
    uVar7 = (uVar7 & a[lVar11]) >> (bVar4 & 0x3f);
    if (0x40 < iVar1 % 0x40 + iVar2) {
      uVar10 = uVar10 >> (-bVar4 & 0x3f);
      m[lVar11 + 1] = m[lVar11 + 1] | uVar10;
      uVar7 = uVar7 | (uVar10 & a[lVar11 + 1]) << (-bVar4 & 0x3f);
    }
    uVar3 = uVar3 | uVar7 << ((byte)iVar8 & 0x3f);
    iVar8 = iVar8 + iVar2;
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  bVar4 = (byte)iVar8;
  switch(bf->mode) {
  case BF_SIGNED:
    bVar5 = bVar4 - 1;
    break;
  case BF_SLIGHTLY_SIGNED:
    if ((uVar3 >> ((ulong)(byte)(bVar4 - 1) & 0x3f) & 1) == 0) goto switchD_00246484_default;
    bVar5 = bVar4 - 2;
    break;
  case BF_ULTRASIGNED:
    goto switchD_00246484_caseD_3;
  case BF_LUT:
    uVar3 = bf->lut[uVar3];
  default:
    goto switchD_00246484_default;
  }
  if ((uVar3 >> ((ulong)bVar5 & 0x3f) & 1) != 0) {
switchD_00246484_caseD_3:
    uVar3 = uVar3 + (-1L << (bVar4 & 0x3f));
  }
switchD_00246484_default:
  return (uVar3 ^ bf->xorend) + bf->addend;
}

Assistant:

ull getbf(const struct bitfield *bf, ull *a, ull *m) {
	ull res = 0;
	int pos = bf->shr;
	int i;
	for (i = 0; i < sizeof(bf->sbf) / sizeof(bf->sbf[0]); i++) {
		res |= BF(bf->sbf[i].pos, bf->sbf[i].len) << pos;
		pos += bf->sbf[i].len;
	}
	switch (bf->mode) {
		case BF_UNSIGNED:
			break;
		case BF_SIGNED:
			if (res & 1ull << (pos - 1))
				res -= 1ull << pos;
			break;
		case BF_SLIGHTLY_SIGNED:
			if (res & 1ull << (pos - 1) && res & 1ull << (pos - 2))
				res -= 1ull << pos;
			break;
		case BF_ULTRASIGNED:
			res -= 1ull << pos;
			break;
		case BF_LUT:
			res = bf->lut[res];
			break;
	}
	res ^= bf->xorend;
	res += bf->addend;
	return res;
}